

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth2-server.c
# Opt level: O0

void free_auth_kbdint(AuthKbdInt *aki)

{
  int local_14;
  int i;
  AuthKbdInt *aki_local;
  
  if (aki != (AuthKbdInt *)0x0) {
    safefree(aki->title);
    safefree(aki->instruction);
    for (local_14 = 0; local_14 < aki->nprompts; local_14 = local_14 + 1) {
      safefree(aki->prompts[local_14].prompt);
    }
    safefree(aki->prompts);
    safefree(aki);
  }
  return;
}

Assistant:

static void free_auth_kbdint(AuthKbdInt *aki)
{
    int i;

    if (!aki)
        return;

    sfree(aki->title);
    sfree(aki->instruction);
    for (i = 0; i < aki->nprompts; i++)
        sfree(aki->prompts[i].prompt);
    sfree(aki->prompts);
    sfree(aki);
}